

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O2

CURLcode cr_null_read(Curl_easy *data,Curl_creader *reader,char *buf,size_t blen,size_t *pnread,
                     _Bool *peos)

{
  *pnread = 0;
  *peos = true;
  return CURLE_OK;
}

Assistant:

static CURLcode cr_null_read(struct Curl_easy *data,
                             struct Curl_creader *reader,
                             char *buf, size_t blen,
                             size_t *pnread, bool *peos)
{
  (void)data;
  (void)reader;
  (void)buf;
  (void)blen;
  *pnread = 0;
  *peos = TRUE;
  return CURLE_OK;
}